

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_xref.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  QPDF qpdf;
  QPDF aQStack_68 [8];
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  local_60 [8];
  _Rb_tree_node_base local_58;
  
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"usage: test_xref INPUT.pdf");
    std::endl<char,std::char_traits<char>>(poVar2);
LAB_001025d1:
    exit(2);
  }
  QPDF::QPDF(aQStack_68);
  QPDF::processFile((char *)aQStack_68,argv[1]);
  QPDF::getXRefTable();
  p_Var3 = local_58._M_left;
  do {
    if (p_Var3 == &local_58) {
      std::
      _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
      ::~_Rb_tree(local_60);
      QPDF::~QPDF(aQStack_68);
      return 0;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var3[1]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&p_Var3[1].field_0x4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    iVar1 = QPDFXRefEntry::getType();
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"free entry",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      poVar2 = (ostream *)&std::cout;
    }
    else if (iVar1 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"uncompressed, offset = ",0x17);
      QPDFXRefEntry::getOffset();
      poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (0x",4);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      QPDFXRefEntry::getOffset();
      poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    }
    else {
      if (iVar1 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"unknown",7);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_001025d1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"compressed, stream number = ",0x1c);
      iVar1 = QPDFXRefEntry::getObjStreamNumber();
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", stream index = ",0x11);
      iVar1 = QPDFXRefEntry::getObjStreamIndex();
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    }
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 2) {
        std::cerr << "usage: test_xref INPUT.pdf" << std::endl;
        std::exit(2);
    }

    try {
        QPDF qpdf;
        qpdf.processFile(argv[1]);

        for (auto const& iter: qpdf.getXRefTable()) {
            std::cout << iter.first.getObj() << "/" << iter.first.getGen() << ", ";
            switch (iter.second.getType()) {
            case 0:
                std::cout << "free entry" << std::endl;
                break;
            case 1:
                std::cout << "uncompressed, offset = " << iter.second.getOffset() << " (0x"
                          << std::hex << iter.second.getOffset() << std::dec << ")" << std::endl;
                break;
            case 2:
                std::cout << "compressed, stream number = " << iter.second.getObjStreamNumber()
                          << ", stream index = " << iter.second.getObjStreamIndex() << std::endl;
                break;
            default:
                std::cerr << "unknown" << std::endl;
                std::exit(2);
            }
        }
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        std::exit(2);
    }

    return 0;
}